

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaHash.c
# Opt level: O2

int Gia_ManHashMuxReal(Gia_Man_t *p,int iLitC,int iLit1,int iLit0)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int Lit;
  int *piVar5;
  
  if (p->fAddStrash != 0) {
    __assert_fail("p->fAddStrash == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaHash.c"
                  ,0x20c,"int Gia_ManHashMuxReal(Gia_Man_t *, int, int, int)");
  }
  if (iLitC < 2) {
    if (iLitC != 0) {
      iLit0 = iLit1;
    }
    return iLit0;
  }
  iVar3 = iLit1;
  if (iLit0 < 2) {
    iVar2 = iLitC;
    if (iLit0 != 0) {
      iVar2 = Abc_LitNot(iLitC);
      goto LAB_001eed3d;
    }
  }
  else if (iLit1 < 2) {
    iVar2 = iLitC;
    iVar3 = iLit0;
    if (iLit1 != 0) goto LAB_001eed3d;
    iVar2 = Abc_LitNot(iLitC);
    iLit1 = iLit0;
  }
  else {
    if (iLit0 == iLit1) {
      return iLit0;
    }
    iVar2 = iLit0;
    if ((iLitC != iLit0) && (iVar4 = Abc_LitNot(iLit1), iVar4 != iLitC)) {
      if ((iLitC != iLit1) && (iVar4 = Abc_LitNot(iLit0), iVar4 != iLitC)) {
        iVar3 = Abc_Lit2Var(iLit0);
        iVar2 = Abc_Lit2Var(iLit1);
        if (iVar3 == iVar2) {
          iVar3 = Gia_ManHashXorReal(p,iLitC,iLit0);
          return iVar3;
        }
        iVar3 = iLit0;
        if ((uint)iLit1 < (uint)iLit0) {
          iLitC = Abc_LitNot(iLitC);
          iVar3 = iLit1;
          iLit1 = iLit0;
        }
        iVar2 = Abc_LitIsCompl(iLit1);
        if (iVar2 != 0) {
          iVar3 = Abc_LitNot(iVar3);
          iLit1 = Abc_LitNot(iLit1);
        }
        piVar5 = Gia_ManHashFind(p,iVar3,iLit1,iLitC);
        iVar4 = *piVar5;
        if (iVar4 == 0) {
          p->nHashMiss = p->nHashMiss + 1;
          iVar4 = (p->vHash).nSize;
          iVar1 = (p->vHash).nCap;
          Lit = Gia_ManAppendMuxReal(p,iLitC,iLit1,iVar3);
          if ((iVar1 <= iVar4) && (piVar5 = Gia_ManHashFind(p,iVar3,iLit1,iLitC), *piVar5 != 0)) {
            __assert_fail("*pPlace == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaHash.c"
                          ,0x22e,"int Gia_ManHashMuxReal(Gia_Man_t *, int, int, int)");
          }
          iVar4 = Abc_Lit2Var(Lit);
          *piVar5 = iVar4;
        }
        else {
          p->nHashHit = p->nHashHit + 1;
        }
        iVar3 = Abc_Var2Lit(iVar4,(uint)(iVar2 != 0));
        return iVar3;
      }
LAB_001eed3d:
      iVar3 = Gia_ManHashOr(p,iVar2,iVar3);
      return iVar3;
    }
  }
  iVar3 = Gia_ManHashAnd(p,iVar2,iLit1);
  return iVar3;
}

Assistant:

int Gia_ManHashMuxReal( Gia_Man_t * p, int iLitC, int iLit1, int iLit0 )  
{
    int fCompl = 0;
    assert( p->fAddStrash == 0 );
    if ( iLitC < 2 )
        return iLitC ? iLit1 : iLit0;
    if ( iLit0 < 2 )
        return iLit0 ? Gia_ManHashOr(p, Abc_LitNot(iLitC), iLit1) : Gia_ManHashAnd(p, iLitC, iLit1);
    if ( iLit1 < 2 )
        return iLit1 ? Gia_ManHashOr(p, iLitC, iLit0) : Gia_ManHashAnd(p, Abc_LitNot(iLitC), iLit0);
    assert( iLit0 > 1 && iLit1 > 1 && iLitC > 1 );
    if ( iLit0 == iLit1 )
        return iLit0;
    if ( iLitC == iLit0 || iLitC == Abc_LitNot(iLit1) )
        return Gia_ManHashAnd(p, iLit0, iLit1);
    if ( iLitC == iLit1 || iLitC == Abc_LitNot(iLit0) )
        return Gia_ManHashOr(p, iLit0, iLit1);
    if ( Abc_Lit2Var(iLit0) == Abc_Lit2Var(iLit1) )
        return Gia_ManHashXorReal( p, iLitC, iLit0 );
    if ( iLit0 > iLit1 )
        iLit0 ^= iLit1, iLit1 ^= iLit0, iLit0 ^= iLit1, iLitC = Abc_LitNot(iLitC);
    if ( Abc_LitIsCompl(iLit1) )
        iLit0 = Abc_LitNot(iLit0), iLit1 = Abc_LitNot(iLit1), fCompl = 1;
    {
        int *pPlace = Gia_ManHashFind( p, iLit0, iLit1, iLitC );
        if ( *pPlace )
        {
            p->nHashHit++;
            return Abc_Var2Lit( *pPlace, fCompl );
        }
        p->nHashMiss++;
        if ( Vec_IntSize(&p->vHash) < Vec_IntCap(&p->vHash) )
            *pPlace = Abc_Lit2Var( Gia_ManAppendMuxReal( p, iLitC, iLit1, iLit0 ) );
        else
        {
            int iNode = Gia_ManAppendMuxReal( p, iLitC, iLit1, iLit0 );
            pPlace = Gia_ManHashFind( p, iLit0, iLit1, iLitC );
            assert( *pPlace == 0 );
            *pPlace = Abc_Lit2Var( iNode );
        }
        return Abc_Var2Lit( *pPlace, fCompl );
    }
}